

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exec.cc
# Opt level: O1

void __thiscall
cnn::SimpleExecutionEngine::backward(SimpleExecutionEngine *this,VariableIndex *from_where)

{
  uint uVar1;
  pointer pTVar2;
  ComputationGraph *pCVar3;
  pointer pTVar4;
  pointer pTVar5;
  pointer pVVar6;
  pointer ppNVar7;
  Node *pNVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined8 uVar11;
  ulong uVar12;
  undefined8 uVar13;
  byte bVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  float *pfVar17;
  pointer pVVar18;
  ulong uVar19;
  uint uVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  ulong __new_size;
  ulong uVar24;
  bool bVar25;
  ushort uVar26;
  byte bVar27;
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  int iVar38;
  vector<bool,_std::allocator<bool>_> needs_derivative;
  vector<bool,_std::allocator<bool>_> in_computation;
  vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> xs;
  allocator_type local_a9;
  vector<bool,_std::allocator<bool>_> local_a8;
  ulong local_78;
  vector<bool,_std::allocator<bool>_> local_70;
  undefined1 local_48 [16];
  pointer local_38;
  undefined1 auVar37 [64];
  
  uVar20 = from_where->t;
  uVar22 = (ulong)uVar20;
  __new_size = (ulong)(uVar20 + 1);
  pTVar2 = (this->nfxs).super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((ulong)(((long)(this->nfxs).super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>.
                     _M_impl.super__Vector_impl_data._M_finish - (long)pTVar2 >> 3) *
             -0x71c71c71c71c71c7) < __new_size) {
    __assert_fail("from_where+1 <= nfxs.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/LeonCrashCode[P]LookAheadFeature/cnn/exec.cc"
                  ,0x56,"virtual void cnn::SimpleExecutionEngine::backward(VariableIndex)");
  }
  pCVar3 = (this->super_ExecutionEngine).cg;
  if ((ulong)((long)(pCVar3->nodes).super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(pCVar3->nodes).super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>.
                    _M_impl.super__Vector_impl_data._M_start >> 3) < __new_size) {
    __assert_fail("from_where+1 <= cg.nodes.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/LeonCrashCode[P]LookAheadFeature/cnn/exec.cc"
                  ,0x57,"virtual void cnn::SimpleExecutionEngine::backward(VariableIndex)");
  }
  uVar23 = (ulong)pTVar2[uVar22].d.nd;
  if (uVar23 == 0) {
    iVar38 = 1;
  }
  else {
    auVar30 = vpbroadcastq_avx512f();
    auVar31 = vpbroadcastd_avx512f(ZEXT416(1));
    uVar21 = 0;
    auVar32 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar33 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    do {
      auVar34 = vmovdqa64_avx512f(auVar31);
      auVar31 = vpbroadcastq_avx512f();
      auVar35 = vporq_avx512f(auVar31,auVar32);
      auVar31 = vporq_avx512f(auVar31,auVar33);
      uVar11 = vpcmpuq_avx512f(auVar31,auVar30,2);
      bVar14 = (byte)uVar11;
      uVar11 = vpcmpuq_avx512f(auVar35,auVar30,2);
      bVar27 = (byte)uVar11;
      uVar26 = CONCAT11(bVar27,bVar14);
      auVar31 = vmovdqu32_avx512f(*(undefined1 (*) [64])(pTVar2[uVar22].d.d + uVar21));
      auVar35._4_4_ = (uint)((byte)(uVar26 >> 1) & 1) * auVar31._4_4_;
      auVar35._0_4_ = (uint)(bVar14 & 1) * auVar31._0_4_;
      auVar35._8_4_ = (uint)((byte)(uVar26 >> 2) & 1) * auVar31._8_4_;
      auVar35._12_4_ = (uint)((byte)(uVar26 >> 3) & 1) * auVar31._12_4_;
      auVar35._16_4_ = (uint)((byte)(uVar26 >> 4) & 1) * auVar31._16_4_;
      auVar35._20_4_ = (uint)((byte)(uVar26 >> 5) & 1) * auVar31._20_4_;
      auVar35._24_4_ = (uint)((byte)(uVar26 >> 6) & 1) * auVar31._24_4_;
      auVar35._28_4_ = (uint)((byte)(uVar26 >> 7) & 1) * auVar31._28_4_;
      auVar35._32_4_ = (uint)(bVar27 & 1) * auVar31._32_4_;
      auVar35._36_4_ = (uint)(bVar27 >> 1 & 1) * auVar31._36_4_;
      auVar35._40_4_ = (uint)(bVar27 >> 2 & 1) * auVar31._40_4_;
      auVar35._44_4_ = (uint)(bVar27 >> 3 & 1) * auVar31._44_4_;
      auVar35._48_4_ = (uint)(bVar27 >> 4 & 1) * auVar31._48_4_;
      auVar35._52_4_ = (uint)(bVar27 >> 5 & 1) * auVar31._52_4_;
      auVar35._56_4_ = (uint)(bVar27 >> 6 & 1) * auVar31._56_4_;
      auVar35._60_4_ = (uint)(bVar27 >> 7) * auVar31._60_4_;
      auVar31 = vpmulld_avx512f(auVar35,auVar34);
      uVar21 = uVar21 + 0x10;
    } while ((uVar23 + 0xf & 0x1fffffff0) != uVar21);
    auVar31 = vmovdqa32_avx512f(auVar31);
    auVar30._0_4_ = (uint)(bVar14 & 1) * auVar31._0_4_ | (uint)!(bool)(bVar14 & 1) * auVar34._0_4_;
    bVar25 = (bool)((byte)(uVar26 >> 1) & 1);
    auVar30._4_4_ = (uint)bVar25 * auVar31._4_4_ | (uint)!bVar25 * auVar34._4_4_;
    bVar25 = (bool)((byte)(uVar26 >> 2) & 1);
    auVar30._8_4_ = (uint)bVar25 * auVar31._8_4_ | (uint)!bVar25 * auVar34._8_4_;
    bVar25 = (bool)((byte)(uVar26 >> 3) & 1);
    auVar30._12_4_ = (uint)bVar25 * auVar31._12_4_ | (uint)!bVar25 * auVar34._12_4_;
    bVar25 = (bool)((byte)(uVar26 >> 4) & 1);
    auVar30._16_4_ = (uint)bVar25 * auVar31._16_4_ | (uint)!bVar25 * auVar34._16_4_;
    bVar25 = (bool)((byte)(uVar26 >> 5) & 1);
    auVar30._20_4_ = (uint)bVar25 * auVar31._20_4_ | (uint)!bVar25 * auVar34._20_4_;
    bVar25 = (bool)((byte)(uVar26 >> 6) & 1);
    auVar30._24_4_ = (uint)bVar25 * auVar31._24_4_ | (uint)!bVar25 * auVar34._24_4_;
    bVar25 = (bool)((byte)(uVar26 >> 7) & 1);
    auVar30._28_4_ = (uint)bVar25 * auVar31._28_4_ | (uint)!bVar25 * auVar34._28_4_;
    auVar30._32_4_ =
         (uint)(bVar27 & 1) * auVar31._32_4_ | (uint)!(bool)(bVar27 & 1) * auVar34._32_4_;
    bVar25 = (bool)(bVar27 >> 1 & 1);
    auVar30._36_4_ = (uint)bVar25 * auVar31._36_4_ | (uint)!bVar25 * auVar34._36_4_;
    bVar25 = (bool)(bVar27 >> 2 & 1);
    auVar30._40_4_ = (uint)bVar25 * auVar31._40_4_ | (uint)!bVar25 * auVar34._40_4_;
    bVar25 = (bool)(bVar27 >> 3 & 1);
    auVar30._44_4_ = (uint)bVar25 * auVar31._44_4_ | (uint)!bVar25 * auVar34._44_4_;
    bVar25 = (bool)(bVar27 >> 4 & 1);
    auVar30._48_4_ = (uint)bVar25 * auVar31._48_4_ | (uint)!bVar25 * auVar34._48_4_;
    bVar25 = (bool)(bVar27 >> 5 & 1);
    auVar30._52_4_ = (uint)bVar25 * auVar31._52_4_ | (uint)!bVar25 * auVar34._52_4_;
    bVar25 = (bool)(bVar27 >> 6 & 1);
    auVar30._56_4_ = (uint)bVar25 * auVar31._56_4_ | (uint)!bVar25 * auVar34._56_4_;
    auVar30._60_4_ =
         (uint)(bVar27 >> 7) * auVar31._60_4_ | (uint)!(bool)(bVar27 >> 7) * auVar34._60_4_;
    auVar28 = vextracti64x4_avx512f(auVar30,1);
    auVar30 = vpmulld_avx512f(auVar30,ZEXT3264(auVar28));
    auVar9 = vpmulld_avx(auVar30._0_16_,auVar30._16_16_);
    auVar10 = vpshufd_avx(auVar9,0xee);
    auVar9 = vpmulld_avx(auVar9,auVar10);
    auVar10 = vpshufd_avx(auVar9,0x55);
    auVar9 = vpmulld_avx(auVar9,auVar10);
    iVar38 = auVar9._0_4_;
  }
  if (iVar38 * pTVar2[uVar22].d.bd != 1) {
    std::operator<<((ostream *)&std::cerr,"backward() called on non-scalar node.\n");
    abort();
  }
  std::vector<cnn::Tensor,_std::allocator<cnn::Tensor>_>::resize(&this->ndEdfs,__new_size);
  dEdfs->used = 0;
  if (__new_size != 0) {
    uVar23 = 0;
    auVar30 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar31 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    do {
      pTVar4 = (this->nfxs).super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar1 = pTVar4[uVar23].d.bd;
      local_a8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_end_of_storage =
           (_Bit_pointer)
           CONCAT44(local_a8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_end_of_storage._4_4_,uVar1);
      pTVar2 = pTVar4 + uVar23;
      local_a8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish
      .super__Bit_iterator_base._8_8_ = *(undefined8 *)((pTVar2->d).d + 6);
      local_a8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p = *(_Bit_type **)(pTVar2->d).d;
      local_a8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_offset = (pTVar2->d).d[2];
      local_a8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._12_4_ = (pTVar2->d).d[3];
      local_a8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish
      .super__Bit_iterator_base._M_p = *(_Bit_type **)((pTVar2->d).d + 4);
      pTVar5 = (this->ndEdfs).super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>._M_impl.
               super__Vector_impl_data._M_start;
      pTVar2 = pTVar4 + uVar23;
      uVar11 = *(undefined8 *)(pTVar2->d).d;
      uVar13 = *(undefined8 *)((pTVar2->d).d + 2);
      uVar15 = *(undefined8 *)((pTVar2->d).d + 4);
      uVar16 = *(undefined8 *)((pTVar2->d).d + 6);
      pTVar5[uVar23].d.bd = pTVar4[uVar23].d.bd;
      pTVar5 = pTVar5 + uVar23;
      *(undefined8 *)(pTVar5->d).d = uVar11;
      *(undefined8 *)((pTVar5->d).d + 2) = uVar13;
      *(undefined8 *)((pTVar5->d).d + 4) = uVar15;
      *(undefined8 *)((pTVar5->d).d + 6) = uVar16;
      uVar21 = (ulong)local_a8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_finish.super__Bit_iterator_base._8_8_ >> 0x20;
      if (uVar21 == 0) {
        iVar38 = 1;
      }
      else {
        auVar32 = vpbroadcastq_avx512f();
        uVar19 = 0;
        auVar33 = vpbroadcastd_avx512f(ZEXT416(1));
        do {
          auVar34 = vmovdqa64_avx512f(auVar33);
          auVar33 = vpbroadcastq_avx512f();
          auVar35 = vporq_avx512f(auVar33,auVar30);
          auVar33 = vporq_avx512f(auVar33,auVar31);
          uVar11 = vpcmpuq_avx512f(auVar33,auVar32,2);
          bVar14 = (byte)uVar11;
          uVar11 = vpcmpuq_avx512f(auVar35,auVar32,2);
          bVar27 = (byte)uVar11;
          uVar26 = CONCAT11(bVar27,bVar14);
          auVar33 = vmovdqu32_avx512f(*(undefined1 (*) [64])
                                       ((long)&local_a8.super__Bvector_base<std::allocator<bool>_>.
                                               _M_impl.super__Bvector_impl_data._M_start.
                                               super__Bit_iterator_base._M_p + uVar19 * 4));
          auVar36._4_4_ = (uint)((byte)(uVar26 >> 1) & 1) * auVar33._4_4_;
          auVar36._0_4_ = (uint)(bVar14 & 1) * auVar33._0_4_;
          auVar36._8_4_ = (uint)((byte)(uVar26 >> 2) & 1) * auVar33._8_4_;
          auVar36._12_4_ = (uint)((byte)(uVar26 >> 3) & 1) * auVar33._12_4_;
          auVar36._16_4_ = (uint)((byte)(uVar26 >> 4) & 1) * auVar33._16_4_;
          auVar36._20_4_ = (uint)((byte)(uVar26 >> 5) & 1) * auVar33._20_4_;
          auVar36._24_4_ = (uint)((byte)(uVar26 >> 6) & 1) * auVar33._24_4_;
          auVar36._28_4_ = (uint)((byte)(uVar26 >> 7) & 1) * auVar33._28_4_;
          auVar36._32_4_ = (uint)(bVar27 & 1) * auVar33._32_4_;
          auVar36._36_4_ = (uint)(bVar27 >> 1 & 1) * auVar33._36_4_;
          auVar36._40_4_ = (uint)(bVar27 >> 2 & 1) * auVar33._40_4_;
          auVar36._44_4_ = (uint)(bVar27 >> 3 & 1) * auVar33._44_4_;
          auVar36._48_4_ = (uint)(bVar27 >> 4 & 1) * auVar33._48_4_;
          auVar36._52_4_ = (uint)(bVar27 >> 5 & 1) * auVar33._52_4_;
          auVar36._56_4_ = (uint)(bVar27 >> 6 & 1) * auVar33._56_4_;
          auVar36._60_4_ = (uint)(bVar27 >> 7) * auVar33._60_4_;
          auVar33 = vpmulld_avx512f(auVar36,auVar34);
          uVar19 = uVar19 + 0x10;
        } while ((uVar21 + 0xf & 0x1fffffff0) != uVar19);
        auVar30 = vmovdqa32_avx512f(auVar33);
        auVar31._0_4_ =
             (uint)(bVar14 & 1) * auVar30._0_4_ | (uint)!(bool)(bVar14 & 1) * auVar34._0_4_;
        bVar25 = (bool)((byte)(uVar26 >> 1) & 1);
        auVar31._4_4_ = (uint)bVar25 * auVar30._4_4_ | (uint)!bVar25 * auVar34._4_4_;
        bVar25 = (bool)((byte)(uVar26 >> 2) & 1);
        auVar31._8_4_ = (uint)bVar25 * auVar30._8_4_ | (uint)!bVar25 * auVar34._8_4_;
        bVar25 = (bool)((byte)(uVar26 >> 3) & 1);
        auVar31._12_4_ = (uint)bVar25 * auVar30._12_4_ | (uint)!bVar25 * auVar34._12_4_;
        bVar25 = (bool)((byte)(uVar26 >> 4) & 1);
        auVar31._16_4_ = (uint)bVar25 * auVar30._16_4_ | (uint)!bVar25 * auVar34._16_4_;
        bVar25 = (bool)((byte)(uVar26 >> 5) & 1);
        auVar31._20_4_ = (uint)bVar25 * auVar30._20_4_ | (uint)!bVar25 * auVar34._20_4_;
        bVar25 = (bool)((byte)(uVar26 >> 6) & 1);
        auVar31._24_4_ = (uint)bVar25 * auVar30._24_4_ | (uint)!bVar25 * auVar34._24_4_;
        bVar25 = (bool)((byte)(uVar26 >> 7) & 1);
        auVar31._28_4_ = (uint)bVar25 * auVar30._28_4_ | (uint)!bVar25 * auVar34._28_4_;
        auVar31._32_4_ =
             (uint)(bVar27 & 1) * auVar30._32_4_ | (uint)!(bool)(bVar27 & 1) * auVar34._32_4_;
        bVar25 = (bool)(bVar27 >> 1 & 1);
        auVar31._36_4_ = (uint)bVar25 * auVar30._36_4_ | (uint)!bVar25 * auVar34._36_4_;
        bVar25 = (bool)(bVar27 >> 2 & 1);
        auVar31._40_4_ = (uint)bVar25 * auVar30._40_4_ | (uint)!bVar25 * auVar34._40_4_;
        bVar25 = (bool)(bVar27 >> 3 & 1);
        auVar31._44_4_ = (uint)bVar25 * auVar30._44_4_ | (uint)!bVar25 * auVar34._44_4_;
        bVar25 = (bool)(bVar27 >> 4 & 1);
        auVar31._48_4_ = (uint)bVar25 * auVar30._48_4_ | (uint)!bVar25 * auVar34._48_4_;
        bVar25 = (bool)(bVar27 >> 5 & 1);
        auVar31._52_4_ = (uint)bVar25 * auVar30._52_4_ | (uint)!bVar25 * auVar34._52_4_;
        bVar25 = (bool)(bVar27 >> 6 & 1);
        auVar31._56_4_ = (uint)bVar25 * auVar30._56_4_ | (uint)!bVar25 * auVar34._56_4_;
        auVar31._60_4_ =
             (uint)(bVar27 >> 7) * auVar30._60_4_ | (uint)!(bool)(bVar27 >> 7) * auVar34._60_4_;
        auVar28 = vextracti64x4_avx512f(auVar31,1);
        auVar30 = vpmulld_avx512f(auVar31,ZEXT3264(auVar28));
        auVar9 = vpmulld_avx(auVar30._0_16_,auVar30._16_16_);
        auVar10 = vpshufd_avx(auVar9,0xee);
        auVar9 = vpmulld_avx(auVar9,auVar10);
        auVar10 = vpshufd_avx(auVar9,0x55);
        auVar9 = vpmulld_avx(auVar9,auVar10);
        iVar38 = auVar9._0_4_;
      }
      pfVar17 = (float *)AlignedMemoryPool<6U>::allocate(dEdfs,(ulong)(iVar38 * uVar1) << 2);
      (this->ndEdfs).super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>._M_impl.
      super__Vector_impl_data._M_start[uVar23].v = pfVar17;
      if (pfVar17 == (float *)0x0) {
        __assert_fail("ndEdfs[i].v",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/LeonCrashCode[P]LookAheadFeature/cnn/exec.cc"
                      ,100,"virtual void cnn::SimpleExecutionEngine::backward(VariableIndex)");
      }
      uVar23 = uVar23 + 1;
      auVar30 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar31 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    } while (uVar23 != __new_size);
  }
  if (dEdfs->used != 0) {
    memset(dEdfs->mem,0,dEdfs->used);
  }
  (this->ndEdfs).super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>._M_impl.
  super__Vector_impl_data._M_finish[-1].v = kSCALAR_ONE;
  local_70.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p =
       (_Bit_type *)
       ((ulong)local_70.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
               _M_start.super__Bit_iterator_base._M_p & 0xffffffffffffff00);
  std::vector<bool,_std::allocator<bool>_>::vector
            (&local_a8,__new_size,(bool *)&local_70,(allocator_type *)local_48);
  pCVar3 = (this->super_ExecutionEngine).cg;
  pVVar6 = (pCVar3->parameter_nodes).
           super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pVVar18 = (pCVar3->parameter_nodes).
                 super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>._M_impl
                 .super__Vector_impl_data._M_start; pVVar18 != pVVar6; pVVar18 = pVVar18 + 1) {
    local_a8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p[pVVar18->t >> 6] =
         local_a8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
         _M_start.super__Bit_iterator_base._M_p[pVVar18->t >> 6] | 1L << ((ulong)pVVar18->t & 0x3f);
  }
  if (__new_size != 0) {
    ppNVar7 = (pCVar3->nodes).super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    uVar23 = 0;
    auVar30 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar31 = vpbroadcastq_avx512f(ZEXT816(0x3f));
    auVar32 = vpbroadcastq_avx512f(ZEXT816(1));
    do {
      uVar19 = 1L << (uVar23 & 0x3f);
      uVar21 = local_a8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
               _M_start.super__Bit_iterator_base._M_p[uVar23 >> 6];
      bVar25 = (uVar21 >> (uVar23 & 0x3f) & 1) != 0;
      pNVar8 = ppNVar7[uVar23];
      pVVar18 = *(pointer *)
                 &(pNVar8->args).
                  super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>.
                  _M_impl;
      pVVar6 = (pNVar8->args).
               super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>._M_impl.
               super__Vector_impl_data._M_finish;
      if (pVVar18 != pVVar6) {
        auVar33 = vpbroadcastq_avx512f();
        auVar33 = vpsrlq_avx512f(auVar33,2);
        uVar24 = 0;
        bVar14 = (uVar21 & uVar19) != 0;
        do {
          bVar27 = bVar14;
          auVar34 = vpbroadcastq_avx512f();
          auVar34 = vporq_avx512f(auVar34,auVar30);
          uVar12 = vpcmpuq_avx512f(auVar34,auVar33,2);
          auVar28 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(pVVar18 + uVar24));
          auVar29._4_4_ = (uint)((byte)(uVar12 >> 1) & 1) * auVar28._4_4_;
          auVar29._0_4_ = (uint)((byte)uVar12 & 1) * auVar28._0_4_;
          auVar29._8_4_ = (uint)((byte)(uVar12 >> 2) & 1) * auVar28._8_4_;
          auVar29._12_4_ = (uint)((byte)(uVar12 >> 3) & 1) * auVar28._12_4_;
          auVar29._16_4_ = (uint)((byte)(uVar12 >> 4) & 1) * auVar28._16_4_;
          auVar29._20_4_ = (uint)((byte)(uVar12 >> 5) & 1) * auVar28._20_4_;
          auVar29._24_4_ = (uint)((byte)(uVar12 >> 6) & 1) * auVar28._24_4_;
          auVar29._28_4_ = (uint)(byte)(uVar12 >> 7) * auVar28._28_4_;
          auVar35 = vpmovzxdq_avx512f(auVar29);
          vpsrlq_avx512f(auVar35,6);
          auVar35 = vpandq_avx512f(auVar35,auVar31);
          auVar36 = vpgatherqq_avx512f(local_a8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                       super__Bvector_impl_data._M_start.super__Bit_iterator_base.
                                       _M_p[1]);
          auVar37._8_8_ = (ulong)((byte)(uVar12 >> 1) & 1) * auVar36._8_8_;
          auVar37._0_8_ = (ulong)((byte)uVar12 & 1) * auVar36._0_8_;
          auVar37._16_8_ = (ulong)((byte)(uVar12 >> 2) & 1) * auVar36._16_8_;
          auVar37._24_8_ = (ulong)((byte)(uVar12 >> 3) & 1) * auVar36._24_8_;
          auVar37._32_8_ = (ulong)((byte)(uVar12 >> 4) & 1) * auVar36._32_8_;
          auVar37._40_8_ = (ulong)((byte)(uVar12 >> 5) & 1) * auVar36._40_8_;
          auVar37._48_8_ = (ulong)((byte)(uVar12 >> 6) & 1) * auVar36._48_8_;
          auVar37._56_8_ = (uVar12 >> 7) * auVar36._56_8_;
          auVar35 = vpsrlvq_avx512f(auVar37,auVar35);
          uVar11 = vptestmq_avx512f(auVar35,auVar32);
          bVar14 = bVar27 | (byte)uVar11;
          uVar24 = uVar24 + 8;
        } while ((((ulong)((long)pVVar6 + (-4 - (long)pVVar18)) >> 2) + 8 & 0xfffffffffffffff8) !=
                 uVar24);
        uVar11 = vpcmpuq_avx512f(auVar34,auVar33,6);
        uVar13 = vpcmpuq_avx512f(auVar34,auVar33,2);
        bVar25 = (bVar14 & (byte)uVar13) != 0 || (bVar27 & (byte)uVar11) != 0;
      }
      uVar24 = uVar21 | uVar19;
      if (!bVar25) {
        uVar24 = ~uVar19 & uVar21;
      }
      local_a8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p[uVar23 >> 6] = uVar24;
      uVar23 = uVar23 + 1;
    } while (uVar23 != __new_size);
  }
  auVar9[0xf] = 0;
  auVar9._0_15_ = local_48._1_15_;
  local_48 = auVar9 << 8;
  std::vector<bool,_std::allocator<bool>_>::vector(&local_70,__new_size,(bool *)local_48,&local_a9);
  local_70.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p[uVar20 >> 6] =
       local_70.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
       .super__Bit_iterator_base._M_p[uVar20 >> 6] | 1L << (uVar22 & 0x3f);
  local_48 = (undefined1  [16])0x0;
  local_38 = (pointer)0x0;
  if (-1 < (int)uVar20) {
    do {
      local_78 = uVar22;
      if ((local_70.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._M_p[uVar22 >> 6] >> (uVar22 & 0x3f) & 1) != 0) {
        pNVar8 = (((this->super_ExecutionEngine).cg)->nodes).
                 super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar22];
        std::vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>::resize
                  ((vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *)local_48,
                   (ulong)((long)(pNVar8->args).
                                 super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(pNVar8->args).
                                super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>
                                ._M_impl.super__Vector_impl_data._M_start) >> 2 & 0xffffffff);
        uVar22 = local_78;
        pVVar18 = (pNVar8->args).
                  super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        pVVar6 = (pNVar8->args).
                 super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>._M_impl
                 .super__Vector_impl_data._M_finish;
        if (pVVar18 != pVVar6) {
          uVar20 = 0;
          do {
            uVar1 = pVVar18->t;
            local_70.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_start.super__Bit_iterator_base._M_p[uVar1 >> 6] =
                 local_70.super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[uVar1 >> 6] |
                 1L << ((ulong)uVar1 & 0x3f);
            *(pointer *)(local_48._0_8_ + (ulong)uVar20 * 8) =
                 (this->nfxs).super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>._M_impl.
                 super__Vector_impl_data._M_start + uVar1;
            uVar20 = uVar20 + 1;
            pVVar18 = pVVar18 + 1;
          } while (pVVar18 != pVVar6);
        }
        pVVar18 = (pNVar8->args).
                  super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        pVVar6 = (pNVar8->args).
                 super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>._M_impl
                 .super__Vector_impl_data._M_finish;
        if (pVVar18 != pVVar6) {
          uVar20 = 0;
          do {
            uVar1 = pVVar18->t;
            if ((local_a8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[uVar1 >> 6] >>
                 ((ulong)uVar1 & 0x3f) & 1) != 0) {
              pTVar2 = (this->ndEdfs).super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>.
                       _M_impl.super__Vector_impl_data._M_start;
              Node::backward(pNVar8,(vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>
                                     *)local_48,
                             (this->nfxs).
                             super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>._M_impl.
                             super__Vector_impl_data._M_start + uVar22,pTVar2 + uVar22,uVar20,
                             pTVar2 + uVar1);
            }
            uVar20 = uVar20 + 1;
            pVVar18 = pVVar18 + 1;
          } while (pVVar18 != pVVar6);
        }
      }
      uVar22 = local_78 - 1;
    } while (0 < (long)local_78);
  }
  pCVar3 = (this->super_ExecutionEngine).cg;
  pVVar6 = (pCVar3->parameter_nodes).
           super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pVVar18 = (pCVar3->parameter_nodes).
                 super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>._M_impl
                 .super__Vector_impl_data._M_start; pVVar18 != pVVar6; pVVar18 = pVVar18 + 1) {
    pNVar8 = (((this->super_ExecutionEngine).cg)->nodes).
             super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>._M_impl.
             super__Vector_impl_data._M_start[pVVar18->t];
    (*pNVar8->_vptr_Node[10])
              (pNVar8,(this->ndEdfs).super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>.
                      _M_impl.super__Vector_impl_data._M_start + pVVar18->t);
  }
  if ((pointer)local_48._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_48._0_8_);
  }
  if (local_70.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_70.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
    local_70.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_70.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_offset = 0;
    local_70.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_70.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_offset = 0;
    local_70.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_end_of_storage = (_Bit_pointer)0x0;
  }
  if (local_a8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_a8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
  }
  return;
}

Assistant:

void SimpleExecutionEngine::backward(VariableIndex from_where) {
  assert(from_where+1 <= nfxs.size());
  assert(from_where+1 <= cg.nodes.size());
  if (nfxs[from_where].d.size() != 1) {
    cerr << "backward() called on non-scalar node.\n";
    abort();
  }

  const unsigned num_nodes = from_where+1;
  ndEdfs.resize(num_nodes);
  dEdfs->free();
  for (unsigned i = 0; i < num_nodes; ++i) {
    const auto dim = nfxs[i].d;
    ndEdfs[i].d = dim;
    ndEdfs[i].v = static_cast<float*>(dEdfs->allocate(dim.size() * sizeof(float)));
    assert(ndEdfs[i].v);
  }
  dEdfs->zero_allocated_memory();
  // initialize dE/dE = 1
  ndEdfs.back().v = kSCALAR_ONE;

  // here we find constant paths to avoid doing extra work
  // by default, a node is constant unless
  //   1) it is a parameter node
  //   2) it depends on a non-constant node
  // (thus, functions of constants and inputs end up being
  //  false in this computation)
  vector<bool> needs_derivative(num_nodes, false);
  for (auto i : cg.parameter_nodes)
    needs_derivative[i] = true;

  for (unsigned ni = 0; ni < num_nodes; ++ni) {
    bool nd = needs_derivative[ni];
    for (auto arg : cg.nodes[ni]->args)
      nd |= needs_derivative[arg];
    needs_derivative[ni] = nd;
  }

  // loop in reverse topological order
  // consider only nodes that participate in the computation.
  vector<bool> in_computation(num_nodes, false);
  in_computation[num_nodes - 1] = true;
  vector<const Tensor*> xs;
  for (int i = num_nodes - 1; i >= 0; --i) {
    if (!in_computation[i]) continue;
    const Node* node = cg.nodes[i];
    xs.resize(node->arity());
    unsigned ai = 0;
    for (VariableIndex arg : node->args) {
      in_computation[arg] = true;
      xs[ai] = &nfxs[arg];
      ++ai;
    }
    ai = 0;
    for (VariableIndex arg : node->args) {
      if (needs_derivative[arg]) {
        node->backward(xs, nfxs[i], ndEdfs[i], ai, ndEdfs[arg]);
      }
      ++ai;
    }
  }

  // accumulate gradients into parameters
  // this is simpler than you might find in some other frameworks
  // since we assume parameters come into the graph as a "function"
  // that returns the current value of the parameters
  for (VariableIndex i : cg.parameter_nodes)
    static_cast<ParameterNodeBase*>(cg.nodes[i])->accumulate_grad(ndEdfs[i]);
}